

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

exr_result_t unpack_half_to_float_4chan_planar(exr_decode_pipeline_t *decode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint16_t *puVar8;
  long in_RDI;
  int y;
  int linc3;
  int linc2;
  int linc1;
  int linc0;
  int h;
  int w;
  uint8_t *out3;
  uint8_t *out2;
  uint8_t *out1;
  uint8_t *out0;
  uint16_t *in3;
  uint16_t *in2;
  uint16_t *in1;
  uint16_t *in0;
  uint8_t *srcbuffer;
  int local_6c;
  float *local_50;
  float *local_48;
  float *local_40;
  float *local_38;
  uint16_t *local_10;
  
  iVar1 = *(int *)(*(long *)(in_RDI + 8) + 0xc);
  iVar2 = *(int *)(in_RDI + 0x2c);
  iVar3 = *(int *)(in_RDI + 100);
  iVar4 = *(int *)(*(long *)(in_RDI + 8) + 0x24);
  iVar5 = *(int *)(*(long *)(in_RDI + 8) + 0x54);
  iVar6 = *(int *)(*(long *)(in_RDI + 8) + 0x84);
  iVar7 = *(int *)(*(long *)(in_RDI + 8) + 0xb4);
  local_38 = *(float **)(*(long *)(in_RDI + 8) + 0x28);
  local_40 = *(float **)(*(long *)(in_RDI + 8) + 0x58);
  local_48 = *(float **)(*(long *)(in_RDI + 8) + 0x88);
  local_50 = *(float **)(*(long *)(in_RDI + 8) + 0xb8);
  local_10 = (uint16_t *)(*(long *)(in_RDI + 0x88) + (long)(*(int *)(in_RDI + 0x60) * iVar1 * 8));
  for (local_6c = *(int *)(in_RDI + 0x60); local_6c < iVar2 - iVar3; local_6c = local_6c + 1) {
    puVar8 = local_10 + iVar1;
    (*half_to_float_buffer)(local_38,local_10,iVar1);
    (*half_to_float_buffer)(local_40,puVar8,iVar1);
    (*half_to_float_buffer)(local_48,puVar8 + iVar1,iVar1);
    (*half_to_float_buffer)(local_50,puVar8 + iVar1 + iVar1,iVar1);
    local_38 = (float *)((long)local_38 + (long)iVar4);
    local_40 = (float *)((long)local_40 + (long)iVar5);
    local_48 = (float *)((long)local_48 + (long)iVar6);
    local_50 = (float *)((long)local_50 + (long)iVar7);
    local_10 = (uint16_t *)((long)local_10 + (long)(iVar1 << 3));
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_half_to_float_4chan_planar (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2, *in3;
    uint8_t *       out0, *out1, *out2, *out3;
    int             w, h;
    int             linc0, linc1, linc2, linc3;

    w     = decode->channels[0].width;
    h     = decode->chunk.height - decode->user_line_end_ignore;
    linc0 = decode->channels[0].user_line_stride;
    linc1 = decode->channels[1].user_line_stride;
    linc2 = decode->channels[2].user_line_stride;
    linc3 = decode->channels[3].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;
    out1 = decode->channels[1].decode_to_ptr;
    out2 = decode->channels[2].decode_to_ptr;
    out3 = decode->channels[3].decode_to_ptr;

    /*
     * not actually using y in the loop, so just pre-increment
     * the srcbuffer for any skip
     */
    srcbuffer += decode->user_line_begin_skip * w * 8;

    // planar output
    for (int y = decode->user_line_begin_skip; y < h; ++y)
    {
        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;
        in3 = in2 + w;
        srcbuffer += w * 8; // 4 * sizeof(uint16_t), avoid type conversion

        half_to_float_buffer ((float*) out0, in0, w);
        half_to_float_buffer ((float*) out1, in1, w);
        half_to_float_buffer ((float*) out2, in2, w);
        half_to_float_buffer ((float*) out3, in3, w);

        out0 += linc0;
        out1 += linc1;
        out2 += linc2;
        out3 += linc3;
    }
    return EXR_ERR_SUCCESS;
}